

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O0

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
::read<psql::empty_message<(unsigned_char)51>>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
           *this,empty_message<(unsigned_char)_3_> *msg,bytestring *buffer)

{
  runtime_error *this_00;
  size_t in_RCX;
  string local_98;
  undefined1 local_78 [8];
  error_code err;
  const_buffer local_58;
  undefined1 local_48 [8];
  deserialization_context ctx;
  char local_21;
  bytestring *pbStack_20;
  uint8_t msg_type;
  bytestring *buffer_local;
  empty_message<(unsigned_char)_3_> *msg_local;
  channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *this_local;
  
  local_21 = '\0';
  pbStack_20 = buffer;
  buffer_local = (bytestring *)msg;
  msg_local = (empty_message<(unsigned_char)_3_> *)this;
  channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::read((channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          *)this,(int)buffer,&local_21,in_RCX);
  if (local_21 != '3') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unexpected msg type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  join_0x00000010_0x00000000_ =
       (mutable_buffer)boost::asio::buffer<unsigned_char,std::allocator<unsigned_char>>(pbStack_20);
  boost::asio::const_buffer::const_buffer(&local_58,(mutable_buffer *)&err.cat_);
  deserialization_context::deserialization_context((deserialization_context *)local_48,local_58);
  _local_78 = deserialize_message<psql::empty_message<(unsigned_char)51>>
                        ((empty_message<(unsigned_char)_3_> *)buffer_local,
                         (deserialization_context *)local_48);
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = 0;
  local_98._M_dataplus = (_Alloc_hider)0x0;
  local_98._1_7_ = 0;
  local_98._M_string_length = 0;
  error_info::error_info((error_info *)&local_98);
  check_error_code((error_code *)local_78,(error_info *)&local_98);
  error_info::~error_info((error_info *)&local_98);
  return;
}

Assistant:

void read(Message& msg, bytestring& buffer)
	{
		std::uint8_t msg_type = 0;
		read(buffer, msg_type);
		if (msg_type != Message::message_type) throw std::runtime_error("Unexpected msg type");
		deserialization_context ctx (boost::asio::buffer(buffer));
		auto err = deserialize_message(msg, ctx);
		check_error_code(err, error_info());
	}